

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_wallmarks.cxx
# Opt level: O2

void __thiscall xray_re::xr_level_wallmarks::load(xr_level_wallmarks *this,xr_reader *r)

{
  uint32_t *puVar1;
  xr_reader *s;
  
  s = xr_reader::open_chunk(r,1);
  if (s == (xr_reader *)0x0) {
    s = xr_reader::open_chunk(r,0);
  }
  puVar1 = (s->field_2).m_p_u32;
  (s->field_2).m_p = (uint8_t *)(puVar1 + 1);
  xr_reader::r_seq<std::vector<xray_re::wm_slot*,std::allocator<xray_re::wm_slot*>>,read_wm_slot>
            (s,*puVar1,this);
  xr_reader::close_chunk(r,&s);
  return;
}

Assistant:

void xr_level_wallmarks::load(xr_reader& r)
{
	xr_reader* s = r.open_chunk(1);
	
	//before 1935 chunk_id = 0
	if (s == 0)
		s = r.open_chunk(0);

	s->r_seq(s->r_u32(), m_slots, read_wm_slot());
	r.close_chunk(s);
}